

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_shift_diag(Integer s_a,void *shift)

{
  int *piVar1;
  double *pdVar2;
  long *plVar3;
  float fVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Integer grp;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  int *_vptr;
  Integer iproc;
  long lVar15;
  long lVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long icol;
  long lVar24;
  bool bVar25;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  void *vptr;
  Integer ihi;
  Integer ilo;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  Integer local_70;
  long local_68;
  int local_5c;
  Integer local_58;
  Integer local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  grp = SPA[s_a + 1000].grp;
  local_70 = s_a;
  iproc = pnga_pgroup_nodeid(grp);
  local_58 = pnga_pgroup_nnodes(grp);
  lVar24 = SPA[s_a + 1000].type;
  local_48 = (ulong)(uint)SPA[s_a + 1000].idx_size;
  bVar25 = _ga_sync_begin != 0;
  local_5c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar25) {
    pnga_pgroup_sync(grp);
  }
  local_50 = grp;
  pnga_sprs_array_row_distribution(local_70,iproc,&local_38,&local_40);
  if (0 < local_58) {
    icol = 0;
    lVar24 = lVar24 + -0x3e9;
    do {
      if ((int)local_48 == 4) {
        pnga_sprs_array_access_col_block(local_70,icol,&local_78,&local_80,&local_68);
        if (local_68 != 0) {
          switch(lVar24) {
          case 0:
            if (local_38 <= local_40) {
              iVar9 = *shift;
              lVar15 = local_38;
              do {
                iVar10 = *(int *)(local_78 + ((lVar15 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar15 - local_38) * 4);
                uVar17 = iVar10 - iVar8;
                if (uVar17 != 0 && iVar8 <= iVar10) {
                  uVar23 = 0;
                  do {
                    lVar16 = (long)*(int *)(local_78 + (lVar15 - local_38) * 4) + uVar23;
                    if (lVar15 == *(int *)(local_80 + lVar16 * 4)) {
                      piVar1 = (int *)(local_68 + lVar16 * 4);
                      *piVar1 = *piVar1 + iVar9;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            if (local_38 <= local_40) {
              lVar15 = *shift;
              lVar16 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar16 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar16 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  uVar23 = 0;
                  do {
                    if (lVar16 == *(int *)(local_80 + (long)iVar10 * 4 + uVar23 * 4)) {
                      plVar3 = (long *)(local_68 + (long)iVar10 * 8 + uVar23 * 8);
                      *plVar3 = *plVar3 + lVar15;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar16 != local_40;
                lVar16 = lVar16 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            if (local_38 <= local_40) {
              fVar4 = *shift;
              lVar15 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar15 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar15 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  lVar16 = local_68 + (long)iVar10 * 4;
                  uVar23 = 0;
                  do {
                    if (lVar15 == *(int *)(local_80 + (long)iVar10 * 4 + uVar23 * 4)) {
                      *(float *)(lVar16 + uVar23 * 4) = *(float *)(lVar16 + uVar23 * 4) + fVar4;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            if (local_38 <= local_40) {
              dVar5 = *shift;
              lVar15 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar15 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar15 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  lVar16 = local_68 + (long)iVar10 * 8;
                  uVar23 = 0;
                  do {
                    if (lVar15 == *(int *)(local_80 + (long)iVar10 * 4 + uVar23 * 4)) {
                      *(double *)(lVar16 + uVar23 * 8) = *(double *)(lVar16 + uVar23 * 8) + dVar5;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            if (local_38 <= local_40) {
              uVar6 = *shift;
              lVar15 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar15 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar15 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  lVar16 = local_68 + (long)iVar10 * 8;
                  uVar23 = 0;
                  do {
                    if (lVar15 == *(int *)(local_80 + (long)iVar10 * 4 + uVar23 * 4)) {
                      uVar7 = *(undefined8 *)(lVar16 + uVar23 * 8);
                      *(ulong *)(lVar16 + uVar23 * 8) =
                           CONCAT44((float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                                    (float)uVar7 + (float)uVar6);
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            if (local_38 <= local_40) {
              dVar5 = *shift;
              dVar14 = *(double *)((long)shift + 8);
              lVar15 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar15 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar15 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  lVar16 = (long)iVar10 * 0x10 + local_68;
                  lVar20 = 0;
                  do {
                    if (lVar15 == *(int *)(local_80 + (long)iVar10 * 4 + lVar20)) {
                      pdVar2 = (double *)(lVar16 + lVar20 * 4);
                      dVar13 = pdVar2[1] + dVar14;
                      auVar11._8_4_ = SUB84(dVar13,0);
                      auVar11._0_8_ = *pdVar2 + dVar5;
                      auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *(undefined1 (*) [16])(lVar16 + lVar20 * 4) = auVar11;
                    }
                    lVar20 = lVar20 + 4;
                  } while ((ulong)uVar17 << 2 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            if (local_38 <= local_40) {
              lVar15 = *shift;
              lVar16 = local_38;
              do {
                iVar9 = *(int *)(local_78 + ((lVar16 + 1) - local_38) * 4);
                iVar10 = *(int *)(local_78 + (lVar16 - local_38) * 4);
                uVar17 = iVar9 - iVar10;
                if (uVar17 != 0 && iVar10 <= iVar9) {
                  uVar23 = 0;
                  do {
                    if (lVar16 == *(int *)(local_80 + (long)iVar10 * 4 + uVar23 * 4)) {
                      plVar3 = (long *)(local_68 + (long)iVar10 * 8 + uVar23 * 8);
                      *plVar3 = *plVar3 + lVar15;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar17 != uVar23);
                }
                bVar25 = lVar16 != local_40;
                lVar16 = lVar16 + 1;
              } while (bVar25);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(local_70,icol,&local_88,&local_90,&local_68);
        if (local_68 != 0) {
          switch(lVar24) {
          case 0:
            if (local_38 <= local_40) {
              iVar9 = *shift;
              lVar15 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar15 + 1) - local_38) * 8);
                lVar20 = *(long *)(local_88 + (lVar15 - local_38) * 8);
                if (lVar20 < lVar16) {
                  do {
                    if (lVar15 == *(long *)(local_90 + lVar20 * 8)) {
                      piVar1 = (int *)(local_68 + lVar20 * 4);
                      *piVar1 = *piVar1 + iVar9;
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar16 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            if (local_38 <= local_40) {
              lVar15 = *shift;
              lVar16 = local_38;
              do {
                lVar20 = *(long *)(local_88 + ((lVar16 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_88 + (lVar16 - local_38) * 8);
                if (lVar19 < lVar20) {
                  lVar21 = 0;
                  do {
                    lVar22 = *(long *)(local_88 + (lVar16 - local_38) * 8) + lVar21;
                    if (lVar16 == *(long *)(local_90 + lVar22 * 8)) {
                      plVar3 = (long *)(local_68 + lVar22 * 8);
                      *plVar3 = *plVar3 + lVar15;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar20 - lVar19 != lVar21);
                }
                bVar25 = lVar16 != local_40;
                lVar16 = lVar16 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            if (local_38 <= local_40) {
              fVar4 = *shift;
              lVar15 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar15 + 1) - local_38) * 8);
                lVar20 = *(long *)(local_88 + (lVar15 - local_38) * 8);
                if (lVar20 < lVar16) {
                  do {
                    if (lVar15 == *(long *)(local_90 + lVar20 * 8)) {
                      *(float *)(local_68 + lVar20 * 4) = *(float *)(local_68 + lVar20 * 4) + fVar4;
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar16 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            if (local_38 <= local_40) {
              dVar5 = *shift;
              lVar15 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar15 + 1) - local_38) * 8);
                lVar20 = *(long *)(local_88 + (lVar15 - local_38) * 8);
                if (lVar20 < lVar16) {
                  do {
                    if (lVar15 == *(long *)(local_90 + lVar20 * 8)) {
                      *(double *)(local_68 + lVar20 * 8) =
                           *(double *)(local_68 + lVar20 * 8) + dVar5;
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar16 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            if (local_38 <= local_40) {
              uVar6 = *shift;
              lVar15 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar15 + 1) - local_38) * 8);
                lVar20 = *(long *)(local_88 + (lVar15 - local_38) * 8);
                if (lVar20 < lVar16) {
                  do {
                    if (lVar15 == *(long *)(local_90 + lVar20 * 8)) {
                      uVar7 = *(undefined8 *)(local_68 + lVar20 * 8);
                      *(ulong *)(local_68 + lVar20 * 8) =
                           CONCAT44((float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                                    (float)uVar7 + (float)uVar6);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar16 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            if (local_38 <= local_40) {
              dVar5 = *shift;
              dVar14 = *(double *)((long)shift + 8);
              lVar15 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar15 + 1) - local_38) * 8);
                lVar20 = *(long *)(local_88 + (lVar15 - local_38) * 8);
                if (lVar20 < lVar16) {
                  pauVar18 = (undefined1 (*) [16])(lVar20 * 0x10 + local_68);
                  do {
                    if (lVar15 == *(long *)(local_90 + lVar20 * 8)) {
                      dVar13 = *(double *)(*pauVar18 + 8) + dVar14;
                      auVar12._8_4_ = SUB84(dVar13,0);
                      auVar12._0_8_ = *(double *)*pauVar18 + dVar5;
                      auVar12._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *pauVar18 = auVar12;
                    }
                    lVar20 = lVar20 + 1;
                    pauVar18 = pauVar18 + 1;
                  } while (lVar16 != lVar20);
                }
                bVar25 = lVar15 != local_40;
                lVar15 = lVar15 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            if (local_38 <= local_40) {
              lVar15 = *shift;
              lVar16 = local_38;
              do {
                lVar20 = *(long *)(local_88 + ((lVar16 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_88 + (lVar16 - local_38) * 8);
                if (lVar19 < lVar20) {
                  do {
                    if (lVar16 == *(long *)(local_90 + lVar19 * 8)) {
                      plVar3 = (long *)(local_68 + lVar19 * 8);
                      *plVar3 = *plVar3 + lVar15;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar20 != lVar19);
                }
                bVar25 = lVar16 != local_40;
                lVar16 = lVar16 + 1;
              } while (bVar25);
            }
          }
        }
      }
      icol = icol + 1;
    } while (icol != local_58);
  }
  if (local_5c != 0) {
    pnga_pgroup_sync(local_50);
    return;
  }
  return;
}

Assistant:

void pnga_sprs_array_shift_diag(Integer s_a, void *shift)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);

#define SPRS_REAL_SHIFT_DIAG_M(_type,_iptr,_jptr)             \
  {                                                           \
    _type _shift = *((_type*)shift);                          \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[_iptr[i-ilo]+j] += _shift;                    \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

#define SPRS_COMPLEX_SHIFT_DIAG_M(_type,_iptr,_jptr)          \
  {                                                           \
    _type _rshift = ((_type*)shift)[0];                       \
    _type _ishift = ((_type*)shift)[1];                       \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[2*(_iptr[i-ilo]+j)] += _rshift;               \
          _vptr[2*(_iptr[i-ilo]+j)+1] += _ishift;             \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,ilptr,jlptr);
        }
      }
    }
  }

#undef SPRS_REAL_SHIFT_DIAG_M
#undef SPRS_COMPLEX_SHIFT_DIAG_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}